

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  AABBNodeMB4D *node1;
  ulong uVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong unaff_RBX;
  size_t mask;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  NodeRef *pNVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  size_t sVar56;
  uint uVar57;
  ulong uVar58;
  bool bVar59;
  bool bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar119 [16];
  UVIdentity<4> mapUV;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 *local_1538;
  ulong local_1530;
  ulong local_1528;
  NodeRef *local_1520;
  RTCFilterFunctionNArguments args;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  undefined1 local_1448 [16];
  undefined1 local_1438 [16];
  UVIdentity<4> *local_1428;
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  RTCHitN local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  uint local_1338;
  uint uStack_1334;
  uint uStack_1330;
  uint uStack_132c;
  uint uStack_1328;
  uint uStack_1324;
  uint uStack_1320;
  uint uStack_131c;
  undefined1 local_1318 [32];
  int local_12f8;
  int iStack_12f4;
  int iStack_12f0;
  int iStack_12ec;
  int iStack_12e8;
  int iStack_12e4;
  int iStack_12e0;
  int iStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined4 local_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  undefined4 local_11f8;
  undefined4 uStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined4 uStack_11e0;
  undefined4 uStack_11dc;
  NodeRef stack [564];
  
  stack[0] = root;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar110._4_4_ = uVar2;
  auVar110._0_4_ = uVar2;
  auVar110._8_4_ = uVar2;
  auVar110._12_4_ = uVar2;
  auVar110._16_4_ = uVar2;
  auVar110._20_4_ = uVar2;
  auVar110._24_4_ = uVar2;
  auVar110._28_4_ = uVar2;
  local_11f8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  uStack_11f4 = local_11f8;
  uStack_11f0 = local_11f8;
  uStack_11ec = local_11f8;
  uStack_11e8 = local_11f8;
  uStack_11e4 = local_11f8;
  uStack_11e0 = local_11f8;
  uStack_11dc = local_11f8;
  local_1218 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uStack_1214 = local_1218;
  uStack_1210 = local_1218;
  uStack_120c = local_1218;
  uStack_1208 = local_1218;
  uStack_1204 = local_1218;
  uStack_1200 = local_1218;
  uStack_11fc = local_1218;
  local_1298 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_12b8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_12d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1238 = local_1298 * 0.99999964;
  fStack_1234 = local_1238;
  fStack_1230 = local_1238;
  fStack_122c = local_1238;
  fStack_1228 = local_1238;
  fStack_1224 = local_1238;
  fStack_1220 = local_1238;
  fStack_121c = local_1238;
  fVar20 = local_12b8 * 0.99999964;
  local_1258._4_4_ = fVar20;
  local_1258._0_4_ = fVar20;
  fStack_1250 = fVar20;
  fStack_124c = fVar20;
  fStack_1248 = fVar20;
  fStack_1244 = fVar20;
  fStack_1240 = fVar20;
  register0x0000131c = fVar20;
  local_1278 = local_12d8 * 0.99999964;
  fStack_1274 = local_1278;
  fStack_1270 = local_1278;
  fStack_126c = local_1278;
  fStack_1268 = local_1278;
  fStack_1264 = local_1278;
  fStack_1260 = local_1278;
  fStack_125c = local_1278;
  local_1298 = local_1298 * 1.0000004;
  fStack_1294 = local_1298;
  fStack_1290 = local_1298;
  fStack_128c = local_1298;
  fStack_1288 = local_1298;
  fStack_1284 = local_1298;
  fStack_1280 = local_1298;
  fStack_127c = local_1298;
  local_12b8 = local_12b8 * 1.0000004;
  fStack_12b4 = local_12b8;
  fStack_12b0 = local_12b8;
  fStack_12ac = local_12b8;
  fStack_12a8 = local_12b8;
  fStack_12a4 = local_12b8;
  fStack_12a0 = local_12b8;
  fStack_129c = local_12b8;
  local_12d8 = local_12d8 * 1.0000004;
  fStack_12d4 = local_12d8;
  fStack_12d0 = local_12d8;
  fStack_12cc = local_12d8;
  fStack_12c8 = local_12d8;
  fStack_12c4 = local_12d8;
  fStack_12c0 = local_12d8;
  fStack_12bc = local_12d8;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar53 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_12f8 = (tray->tnear).field_0.i[k];
  iStack_12f4 = local_12f8;
  iStack_12f0 = local_12f8;
  iStack_12ec = local_12f8;
  iStack_12e8 = local_12f8;
  iStack_12e4 = local_12f8;
  iStack_12e0 = local_12f8;
  iStack_12dc = local_12f8;
  iVar3 = (tray->tfar).field_0.i[k];
  local_1318._4_4_ = iVar3;
  local_1318._0_4_ = iVar3;
  local_1318._8_4_ = iVar3;
  local_1318._12_4_ = iVar3;
  local_1318._16_4_ = iVar3;
  local_1318._20_4_ = iVar3;
  local_1318._24_4_ = iVar3;
  local_1318._28_4_ = iVar3;
  local_1538 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  pNVar48 = stack + 1;
  do {
    local_1520 = pNVar48;
    if (local_1520 == stack) break;
    pNVar48 = local_1520 + -1;
    sVar56 = local_1520[-1].ptr;
    do {
      if ((sVar56 & 8) == 0) {
        uVar37 = sVar56 & 0xfffffffffffffff0;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar68._4_4_ = uVar2;
        auVar68._0_4_ = uVar2;
        auVar68._8_4_ = uVar2;
        auVar68._12_4_ = uVar2;
        auVar68._16_4_ = uVar2;
        auVar68._20_4_ = uVar2;
        auVar68._24_4_ = uVar2;
        auVar68._28_4_ = uVar2;
        auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar41),auVar68,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + uVar41));
        auVar21 = vsubps_avx(ZEXT1632(auVar61),auVar110);
        auVar22._4_4_ = auVar21._4_4_ * fStack_1234;
        auVar22._0_4_ = auVar21._0_4_ * local_1238;
        auVar22._8_4_ = auVar21._8_4_ * fStack_1230;
        auVar22._12_4_ = auVar21._12_4_ * fStack_122c;
        auVar22._16_4_ = auVar21._16_4_ * fStack_1228;
        auVar22._20_4_ = auVar21._20_4_ * fStack_1224;
        auVar22._24_4_ = auVar21._24_4_ * fStack_1220;
        auVar22._28_4_ = auVar21._28_4_;
        auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar51),auVar68,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + uVar51));
        auVar21._4_4_ = iStack_12f4;
        auVar21._0_4_ = local_12f8;
        auVar21._8_4_ = iStack_12f0;
        auVar21._12_4_ = iStack_12ec;
        auVar21._16_4_ = iStack_12e8;
        auVar21._20_4_ = iStack_12e4;
        auVar21._24_4_ = iStack_12e0;
        auVar21._28_4_ = iStack_12dc;
        auVar21 = vmaxps_avx(auVar21,auVar22);
        auVar36._4_4_ = uStack_11f4;
        auVar36._0_4_ = local_11f8;
        auVar36._8_4_ = uStack_11f0;
        auVar36._12_4_ = uStack_11ec;
        auVar36._16_4_ = uStack_11e8;
        auVar36._20_4_ = uStack_11e4;
        auVar36._24_4_ = uStack_11e0;
        auVar36._28_4_ = uStack_11dc;
        auVar22 = vsubps_avx(ZEXT1632(auVar61),auVar36);
        auVar23._4_4_ = auVar22._4_4_ * (float)local_1258._4_4_;
        auVar23._0_4_ = auVar22._0_4_ * (float)local_1258._0_4_;
        auVar23._8_4_ = auVar22._8_4_ * fStack_1250;
        auVar23._12_4_ = auVar22._12_4_ * fStack_124c;
        auVar23._16_4_ = auVar22._16_4_ * fStack_1248;
        auVar23._20_4_ = auVar22._20_4_ * fStack_1244;
        auVar23._24_4_ = auVar22._24_4_ * fStack_1240;
        auVar23._28_4_ = auVar22._28_4_;
        auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar53),auVar68,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + uVar53));
        auVar35._4_4_ = uStack_1214;
        auVar35._0_4_ = local_1218;
        auVar35._8_4_ = uStack_1210;
        auVar35._12_4_ = uStack_120c;
        auVar35._16_4_ = uStack_1208;
        auVar35._20_4_ = uStack_1204;
        auVar35._24_4_ = uStack_1200;
        auVar35._28_4_ = uStack_11fc;
        auVar22 = vsubps_avx(ZEXT1632(auVar61),auVar35);
        auVar25._4_4_ = auVar22._4_4_ * fStack_1274;
        auVar25._0_4_ = auVar22._0_4_ * local_1278;
        auVar25._8_4_ = auVar22._8_4_ * fStack_1270;
        auVar25._12_4_ = auVar22._12_4_ * fStack_126c;
        auVar25._16_4_ = auVar22._16_4_ * fStack_1268;
        auVar25._20_4_ = auVar22._20_4_ * fStack_1264;
        auVar25._24_4_ = auVar22._24_4_ * fStack_1260;
        auVar25._28_4_ = auVar22._28_4_;
        auVar22 = vmaxps_avx(auVar23,auVar25);
        auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + (uVar41 ^ 0x20)),auVar68,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + (uVar41 ^ 0x20)));
        auVar21 = vmaxps_avx(auVar21,auVar22);
        auVar22 = vsubps_avx(ZEXT1632(auVar61),auVar110);
        auVar26._4_4_ = auVar22._4_4_ * fStack_1294;
        auVar26._0_4_ = auVar22._0_4_ * local_1298;
        auVar26._8_4_ = auVar22._8_4_ * fStack_1290;
        auVar26._12_4_ = auVar22._12_4_ * fStack_128c;
        auVar26._16_4_ = auVar22._16_4_ * fStack_1288;
        auVar26._20_4_ = auVar22._20_4_ * fStack_1284;
        auVar26._24_4_ = auVar22._24_4_ * fStack_1280;
        auVar26._28_4_ = auVar22._28_4_;
        auVar22 = vminps_avx(local_1318,auVar26);
        auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + (uVar51 ^ 0x20)),auVar68,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + (uVar51 ^ 0x20)));
        auVar23 = vsubps_avx(ZEXT1632(auVar61),auVar36);
        auVar27._4_4_ = auVar23._4_4_ * fStack_12b4;
        auVar27._0_4_ = auVar23._0_4_ * local_12b8;
        auVar27._8_4_ = auVar23._8_4_ * fStack_12b0;
        auVar27._12_4_ = auVar23._12_4_ * fStack_12ac;
        auVar27._16_4_ = auVar23._16_4_ * fStack_12a8;
        auVar27._20_4_ = auVar23._20_4_ * fStack_12a4;
        auVar27._24_4_ = auVar23._24_4_ * fStack_12a0;
        auVar27._28_4_ = auVar23._28_4_;
        auVar61 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + (uVar53 ^ 0x20)),auVar68,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + (uVar53 ^ 0x20)));
        auVar23 = vsubps_avx(ZEXT1632(auVar61),auVar35);
        auVar28._4_4_ = auVar23._4_4_ * fStack_12d4;
        auVar28._0_4_ = auVar23._0_4_ * local_12d8;
        auVar28._8_4_ = auVar23._8_4_ * fStack_12d0;
        auVar28._12_4_ = auVar23._12_4_ * fStack_12cc;
        auVar28._16_4_ = auVar23._16_4_ * fStack_12c8;
        auVar28._20_4_ = auVar23._20_4_ * fStack_12c4;
        auVar28._24_4_ = auVar23._24_4_ * fStack_12c0;
        auVar28._28_4_ = auVar23._28_4_;
        auVar23 = vminps_avx(auVar27,auVar28);
        auVar22 = vminps_avx(auVar22,auVar23);
        auVar21 = vcmpps_avx(auVar21,auVar22,2);
        if (((uint)sVar56 & 7) == 6) {
          auVar22 = vcmpps_avx(*(undefined1 (*) [32])(uVar37 + 0x1c0),auVar68,2);
          auVar23 = vcmpps_avx(auVar68,*(undefined1 (*) [32])(uVar37 + 0x1e0),1);
          auVar22 = vandps_avx(auVar22,auVar23);
          auVar21 = vandps_avx(auVar22,auVar21);
          auVar61 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
        }
        else {
          auVar61 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
        }
        auVar61 = vpsllw_avx(auVar61,0xf);
        auVar61 = vpacksswb_avx(auVar61,auVar61);
        unaff_RBX = (ulong)(byte)(SUB161(auVar61 >> 7,0) & 1 | (SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                                  (SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                                  (SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                                  (SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                                  (SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                                  (SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                                 SUB161(auVar61 >> 0x3f,0) << 7);
      }
      if ((sVar56 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar57 = 4;
        }
        else {
          uVar55 = sVar56 & 0xfffffffffffffff0;
          lVar38 = 0;
          for (uVar37 = unaff_RBX; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar57 = 0;
          for (uVar37 = unaff_RBX - 1 & unaff_RBX; sVar56 = *(size_t *)(uVar55 + lVar38 * 8),
              uVar37 != 0; uVar37 = uVar37 - 1 & uVar37) {
            pNVar48->ptr = sVar56;
            pNVar48 = pNVar48 + 1;
            lVar38 = 0;
            for (uVar44 = uVar37; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
              lVar38 = lVar38 + 1;
            }
          }
        }
      }
      else {
        uVar57 = 6;
      }
    } while (uVar57 == 0);
    if (uVar57 == 6) {
      uVar57 = 0;
      local_1530 = (ulong)((uint)sVar56 & 0xf) - 8;
      bVar59 = local_1530 != 0;
      if (bVar59) {
        uVar37 = sVar56 & 0xfffffffffffffff0;
        local_1528 = 0;
        do {
          lVar42 = local_1528 * 0x50;
          pSVar6 = context->scene;
          pGVar7 = (pSVar6->geometries).items[*(uint *)(uVar37 + 0x30 + lVar42)].ptr;
          fVar20 = (pGVar7->time_range).lower;
          fVar20 = pGVar7->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0x70) - fVar20) /
                   ((pGVar7->time_range).upper - fVar20));
          auVar61 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
          auVar61 = vminss_avx(auVar61,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
          auVar81 = vmaxss_avx(ZEXT816(0),auVar61);
          lVar39 = (long)(int)auVar81._0_4_ * 0x38;
          uVar58 = (ulong)*(uint *)(uVar37 + 4 + lVar42);
          lVar38 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar39);
          lVar39 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar39);
          auVar61 = *(undefined1 (*) [16])(lVar38 + (ulong)*(uint *)(uVar37 + lVar42) * 4);
          uVar44 = (ulong)*(uint *)(uVar37 + 0x10 + lVar42);
          auVar100 = *(undefined1 (*) [16])(lVar38 + uVar44 * 4);
          uVar40 = (ulong)*(uint *)(uVar37 + 0x20 + lVar42);
          auVar64 = *(undefined1 (*) [16])(lVar38 + uVar40 * 4);
          auVar70 = *(undefined1 (*) [16])(lVar38 + uVar58 * 4);
          uVar45 = (ulong)*(uint *)(uVar37 + 0x14 + lVar42);
          auVar69 = *(undefined1 (*) [16])(lVar38 + uVar45 * 4);
          uVar46 = (ulong)*(uint *)(uVar37 + 0x24 + lVar42);
          auVar65 = *(undefined1 (*) [16])(lVar38 + uVar46 * 4);
          uVar47 = (ulong)*(uint *)(uVar37 + 8 + lVar42);
          auVar73 = *(undefined1 (*) [16])(lVar38 + uVar47 * 4);
          uVar52 = (ulong)*(uint *)(uVar37 + 0x18 + lVar42);
          auVar94 = *(undefined1 (*) [16])(lVar38 + uVar52 * 4);
          uVar49 = (ulong)*(uint *)(uVar37 + 0x28 + lVar42);
          auVar89 = *(undefined1 (*) [16])(lVar38 + uVar49 * 4);
          uVar55 = (ulong)*(uint *)(uVar37 + 0xc + lVar42);
          auVar90 = *(undefined1 (*) [16])(lVar38 + uVar55 * 4);
          uVar54 = (ulong)*(uint *)(uVar37 + 0x1c + lVar42);
          auVar95 = *(undefined1 (*) [16])(lVar38 + uVar54 * 4);
          uVar50 = (ulong)*(uint *)(uVar37 + 0x2c + lVar42);
          auVar97 = *(undefined1 (*) [16])(lVar38 + uVar50 * 4);
          auVar88 = *(undefined1 (*) [16])(lVar39 + (ulong)*(uint *)(uVar37 + lVar42) * 4);
          auVar91 = *(undefined1 (*) [16])(lVar39 + uVar44 * 4);
          fVar20 = fVar20 - auVar81._0_4_;
          auVar81 = vunpcklps_avx(auVar61,auVar73);
          auVar73 = vunpckhps_avx(auVar61,auVar73);
          auVar77 = vunpcklps_avx(auVar70,auVar90);
          auVar70 = vunpckhps_avx(auVar70,auVar90);
          auVar61 = *(undefined1 (*) [16])(lVar39 + uVar58 * 4);
          auVar62 = vunpcklps_avx(auVar73,auVar70);
          auVar63 = vunpcklps_avx(auVar81,auVar77);
          auVar73 = vunpckhps_avx(auVar81,auVar77);
          auVar90 = vunpcklps_avx(auVar100,auVar94);
          auVar70 = vunpckhps_avx(auVar100,auVar94);
          auVar94 = vunpcklps_avx(auVar69,auVar95);
          auVar69 = vunpckhps_avx(auVar69,auVar95);
          auVar100 = *(undefined1 (*) [16])(lVar39 + uVar47 * 4);
          auVar95 = vunpcklps_avx(auVar70,auVar69);
          auVar81 = vunpcklps_avx(auVar90,auVar94);
          auVar69 = vunpckhps_avx(auVar90,auVar94);
          auVar90 = vunpcklps_avx(auVar64,auVar89);
          auVar94 = vunpckhps_avx(auVar64,auVar89);
          auVar77 = vunpcklps_avx(auVar65,auVar97);
          auVar89 = vunpckhps_avx(auVar65,auVar97);
          auVar70 = *(undefined1 (*) [16])(lVar39 + uVar55 * 4);
          auVar97 = vunpcklps_avx(auVar94,auVar89);
          auVar64 = vunpcklps_avx(auVar90,auVar77);
          auVar94 = vunpckhps_avx(auVar90,auVar77);
          auVar89 = vunpcklps_avx(auVar88,auVar100);
          auVar100 = vunpckhps_avx(auVar88,auVar100);
          auVar90 = vunpcklps_avx(auVar61,auVar70);
          auVar70 = vunpckhps_avx(auVar61,auVar70);
          auVar61 = *(undefined1 (*) [16])(lVar39 + uVar52 * 4);
          auVar88 = vunpcklps_avx(auVar100,auVar70);
          auVar77 = vunpcklps_avx(auVar89,auVar90);
          auVar70 = vunpckhps_avx(auVar89,auVar90);
          auVar90 = vunpcklps_avx(auVar91,auVar61);
          auVar89 = vunpckhps_avx(auVar91,auVar61);
          auVar61 = *(undefined1 (*) [16])(lVar39 + uVar45 * 4);
          auVar100 = *(undefined1 (*) [16])(lVar39 + uVar54 * 4);
          auVar91 = vunpcklps_avx(auVar61,auVar100);
          auVar61 = vunpckhps_avx(auVar61,auVar100);
          auVar65 = vunpcklps_avx(auVar89,auVar61);
          auVar74 = vunpcklps_avx(auVar90,auVar91);
          auVar89 = vunpckhps_avx(auVar90,auVar91);
          auVar61 = *(undefined1 (*) [16])(lVar39 + uVar40 * 4);
          auVar100 = *(undefined1 (*) [16])(lVar39 + uVar49 * 4);
          auVar91 = vunpcklps_avx(auVar61,auVar100);
          auVar90 = vunpckhps_avx(auVar61,auVar100);
          auVar61 = *(undefined1 (*) [16])(lVar39 + uVar46 * 4);
          auVar100 = *(undefined1 (*) [16])(lVar39 + uVar50 * 4);
          auVar78 = vunpcklps_avx(auVar61,auVar100);
          auVar61 = vunpckhps_avx(auVar61,auVar100);
          auVar100 = vunpcklps_avx(auVar90,auVar61);
          auVar90 = vunpcklps_avx(auVar91,auVar78);
          auVar61 = vunpckhps_avx(auVar91,auVar78);
          fVar24 = 1.0 - fVar20;
          auVar113._4_4_ = fVar24;
          auVar113._0_4_ = fVar24;
          auVar113._8_4_ = fVar24;
          auVar113._12_4_ = fVar24;
          auVar91._0_4_ = fVar20 * auVar77._0_4_;
          auVar91._4_4_ = fVar20 * auVar77._4_4_;
          auVar91._8_4_ = fVar20 * auVar77._8_4_;
          auVar91._12_4_ = fVar20 * auVar77._12_4_;
          auVar91 = vfmadd231ps_fma(auVar91,auVar113,auVar63);
          auVar106._0_4_ = fVar20 * auVar70._0_4_;
          auVar106._4_4_ = fVar20 * auVar70._4_4_;
          auVar106._8_4_ = fVar20 * auVar70._8_4_;
          auVar106._12_4_ = fVar20 * auVar70._12_4_;
          auVar70 = vfmadd231ps_fma(auVar106,auVar113,auVar73);
          auVar98._0_4_ = fVar20 * auVar88._0_4_;
          auVar98._4_4_ = fVar20 * auVar88._4_4_;
          auVar98._8_4_ = fVar20 * auVar88._8_4_;
          auVar98._12_4_ = fVar20 * auVar88._12_4_;
          auVar88 = vfmadd231ps_fma(auVar98,auVar113,auVar62);
          auVar87._0_4_ = fVar20 * auVar74._0_4_;
          auVar87._4_4_ = fVar20 * auVar74._4_4_;
          auVar87._8_4_ = fVar20 * auVar74._8_4_;
          auVar87._12_4_ = fVar20 * auVar74._12_4_;
          auVar81 = vfmadd231ps_fma(auVar87,auVar113,auVar81);
          auVar80._0_4_ = fVar20 * auVar89._0_4_;
          auVar80._4_4_ = fVar20 * auVar89._4_4_;
          auVar80._8_4_ = fVar20 * auVar89._8_4_;
          auVar80._12_4_ = fVar20 * auVar89._12_4_;
          auVar89 = vfmadd231ps_fma(auVar80,auVar113,auVar69);
          puVar1 = (undefined8 *)(uVar37 + 0x30 + lVar42);
          local_1468 = *puVar1;
          uStack_1460 = puVar1[1];
          puVar1 = (undefined8 *)(uVar37 + 0x40 + lVar42);
          auVar69._0_4_ = fVar20 * auVar65._0_4_;
          auVar69._4_4_ = fVar20 * auVar65._4_4_;
          auVar69._8_4_ = fVar20 * auVar65._8_4_;
          auVar69._12_4_ = fVar20 * auVar65._12_4_;
          auVar95 = vfmadd231ps_fma(auVar69,auVar113,auVar95);
          auVar73._0_4_ = fVar20 * auVar90._0_4_;
          auVar73._4_4_ = fVar20 * auVar90._4_4_;
          auVar73._8_4_ = fVar20 * auVar90._8_4_;
          auVar73._12_4_ = fVar20 * auVar90._12_4_;
          auVar77._0_4_ = fVar20 * auVar61._0_4_;
          auVar77._4_4_ = fVar20 * auVar61._4_4_;
          auVar77._8_4_ = fVar20 * auVar61._8_4_;
          auVar77._12_4_ = fVar20 * auVar61._12_4_;
          auVar111._0_4_ = fVar20 * auVar100._0_4_;
          auVar111._4_4_ = fVar20 * auVar100._4_4_;
          auVar111._8_4_ = fVar20 * auVar100._8_4_;
          auVar111._12_4_ = fVar20 * auVar100._12_4_;
          auVar90 = vfmadd231ps_fma(auVar73,auVar113,auVar64);
          auVar77 = vfmadd231ps_fma(auVar77,auVar113,auVar94);
          auVar97 = vfmadd231ps_fma(auVar111,auVar113,auVar97);
          local_1478 = *puVar1;
          uStack_1470 = puVar1[1];
          local_1428 = &mapUV;
          uVar2 = *(undefined4 *)(ray + k * 4);
          auVar62._4_4_ = uVar2;
          auVar62._0_4_ = uVar2;
          auVar62._8_4_ = uVar2;
          auVar62._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar114._4_4_ = uVar2;
          auVar114._0_4_ = uVar2;
          auVar114._8_4_ = uVar2;
          auVar114._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar116._4_4_ = uVar2;
          auVar116._0_4_ = uVar2;
          auVar116._8_4_ = uVar2;
          auVar116._12_4_ = uVar2;
          auVar69 = vsubps_avx(auVar91,auVar62);
          auVar73 = vsubps_avx(auVar70,auVar114);
          auVar61 = vsubps_avx(auVar88,auVar116);
          auVar100 = vsubps_avx(auVar81,auVar62);
          auVar70 = vsubps_avx(auVar89,auVar114);
          auVar94 = vsubps_avx(auVar95,auVar116);
          auVar89 = vsubps_avx(auVar90,auVar62);
          auVar90 = vsubps_avx(auVar77,auVar114);
          auVar95 = vsubps_avx(auVar97,auVar116);
          auVar97 = vsubps_avx(auVar89,auVar69);
          auVar88 = vsubps_avx(auVar90,auVar73);
          auVar91 = vsubps_avx(auVar95,auVar61);
          auVar63._0_4_ = auVar89._0_4_ + auVar69._0_4_;
          auVar63._4_4_ = auVar89._4_4_ + auVar69._4_4_;
          auVar63._8_4_ = auVar89._8_4_ + auVar69._8_4_;
          auVar63._12_4_ = auVar89._12_4_ + auVar69._12_4_;
          auVar78._0_4_ = auVar90._0_4_ + auVar73._0_4_;
          auVar78._4_4_ = auVar90._4_4_ + auVar73._4_4_;
          auVar78._8_4_ = auVar90._8_4_ + auVar73._8_4_;
          auVar78._12_4_ = auVar90._12_4_ + auVar73._12_4_;
          fVar24 = auVar61._0_4_;
          auVar81._0_4_ = auVar95._0_4_ + fVar24;
          fVar9 = auVar61._4_4_;
          auVar81._4_4_ = auVar95._4_4_ + fVar9;
          fVar10 = auVar61._8_4_;
          auVar81._8_4_ = auVar95._8_4_ + fVar10;
          fVar11 = auVar61._12_4_;
          auVar81._12_4_ = auVar95._12_4_ + fVar11;
          auVar115._0_4_ = auVar91._0_4_ * auVar78._0_4_;
          auVar115._4_4_ = auVar91._4_4_ * auVar78._4_4_;
          auVar115._8_4_ = auVar91._8_4_ * auVar78._8_4_;
          auVar115._12_4_ = auVar91._12_4_ * auVar78._12_4_;
          auVar77 = vfmsub231ps_fma(auVar115,auVar88,auVar81);
          auVar82._0_4_ = auVar97._0_4_ * auVar81._0_4_;
          auVar82._4_4_ = auVar97._4_4_ * auVar81._4_4_;
          auVar82._8_4_ = auVar97._8_4_ * auVar81._8_4_;
          auVar82._12_4_ = auVar97._12_4_ * auVar81._12_4_;
          auVar81 = vfmsub231ps_fma(auVar82,auVar91,auVar63);
          auVar64._0_4_ = auVar88._0_4_ * auVar63._0_4_;
          auVar64._4_4_ = auVar88._4_4_ * auVar63._4_4_;
          auVar64._8_4_ = auVar88._8_4_ * auVar63._8_4_;
          auVar64._12_4_ = auVar88._12_4_ * auVar63._12_4_;
          auVar62 = vfmsub231ps_fma(auVar64,auVar97,auVar78);
          fVar20 = *(float *)(ray + k * 4 + 0x60);
          auVar74._0_4_ = fVar20 * auVar62._0_4_;
          auVar74._4_4_ = fVar20 * auVar62._4_4_;
          auVar74._8_4_ = fVar20 * auVar62._8_4_;
          auVar74._12_4_ = fVar20 * auVar62._12_4_;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar107._4_4_ = uVar2;
          auVar107._0_4_ = uVar2;
          auVar107._8_4_ = uVar2;
          auVar107._12_4_ = uVar2;
          auVar81 = vfmadd231ps_fma(auVar74,auVar107,auVar81);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar117._4_4_ = uVar2;
          auVar117._0_4_ = uVar2;
          auVar117._8_4_ = uVar2;
          auVar117._12_4_ = uVar2;
          auVar64 = vfmadd231ps_fma(auVar81,auVar117,auVar77);
          auVar81 = vsubps_avx(auVar73,auVar70);
          auVar77 = vsubps_avx(auVar61,auVar94);
          auVar79._0_4_ = auVar73._0_4_ + auVar70._0_4_;
          auVar79._4_4_ = auVar73._4_4_ + auVar70._4_4_;
          auVar79._8_4_ = auVar73._8_4_ + auVar70._8_4_;
          auVar79._12_4_ = auVar73._12_4_ + auVar70._12_4_;
          auVar83._0_4_ = auVar94._0_4_ + fVar24;
          auVar83._4_4_ = auVar94._4_4_ + fVar9;
          auVar83._8_4_ = auVar94._8_4_ + fVar10;
          auVar83._12_4_ = auVar94._12_4_ + fVar11;
          fVar12 = auVar77._0_4_;
          auVar92._0_4_ = auVar79._0_4_ * fVar12;
          fVar14 = auVar77._4_4_;
          auVar92._4_4_ = auVar79._4_4_ * fVar14;
          fVar16 = auVar77._8_4_;
          auVar92._8_4_ = auVar79._8_4_ * fVar16;
          fVar18 = auVar77._12_4_;
          auVar92._12_4_ = auVar79._12_4_ * fVar18;
          auVar63 = vfmsub231ps_fma(auVar92,auVar81,auVar83);
          auVar62 = vsubps_avx(auVar69,auVar100);
          fVar118 = auVar62._0_4_;
          auVar99._0_4_ = fVar118 * auVar83._0_4_;
          fVar120 = auVar62._4_4_;
          auVar99._4_4_ = fVar120 * auVar83._4_4_;
          fVar121 = auVar62._8_4_;
          auVar99._8_4_ = fVar121 * auVar83._8_4_;
          fVar122 = auVar62._12_4_;
          auVar99._12_4_ = fVar122 * auVar83._12_4_;
          auVar84._0_4_ = auVar69._0_4_ + auVar100._0_4_;
          auVar84._4_4_ = auVar69._4_4_ + auVar100._4_4_;
          auVar84._8_4_ = auVar69._8_4_ + auVar100._8_4_;
          auVar84._12_4_ = auVar69._12_4_ + auVar100._12_4_;
          auVar61 = vfmsub231ps_fma(auVar99,auVar77,auVar84);
          fVar13 = auVar81._0_4_;
          auVar85._0_4_ = auVar84._0_4_ * fVar13;
          fVar15 = auVar81._4_4_;
          auVar85._4_4_ = auVar84._4_4_ * fVar15;
          fVar17 = auVar81._8_4_;
          auVar85._8_4_ = auVar84._8_4_ * fVar17;
          fVar19 = auVar81._12_4_;
          auVar85._12_4_ = auVar84._12_4_ * fVar19;
          auVar65 = vfmsub231ps_fma(auVar85,auVar62,auVar79);
          auVar86._0_4_ = fVar20 * auVar65._0_4_;
          auVar86._4_4_ = fVar20 * auVar65._4_4_;
          auVar86._8_4_ = fVar20 * auVar65._8_4_;
          auVar86._12_4_ = fVar20 * auVar65._12_4_;
          auVar61 = vfmadd231ps_fma(auVar86,auVar107,auVar61);
          local_1448 = vfmadd231ps_fma(auVar61,auVar117,auVar63);
          auVar63 = vsubps_avx(auVar100,auVar89);
          auVar93._0_4_ = auVar89._0_4_ + auVar100._0_4_;
          auVar93._4_4_ = auVar89._4_4_ + auVar100._4_4_;
          auVar93._8_4_ = auVar89._8_4_ + auVar100._8_4_;
          auVar93._12_4_ = auVar89._12_4_ + auVar100._12_4_;
          auVar89 = vsubps_avx(auVar70,auVar90);
          auVar65._0_4_ = auVar70._0_4_ + auVar90._0_4_;
          auVar65._4_4_ = auVar70._4_4_ + auVar90._4_4_;
          auVar65._8_4_ = auVar70._8_4_ + auVar90._8_4_;
          auVar65._12_4_ = auVar70._12_4_ + auVar90._12_4_;
          auVar90 = vsubps_avx(auVar94,auVar95);
          auVar61._0_4_ = auVar94._0_4_ + auVar95._0_4_;
          auVar61._4_4_ = auVar94._4_4_ + auVar95._4_4_;
          auVar61._8_4_ = auVar94._8_4_ + auVar95._8_4_;
          auVar61._12_4_ = auVar94._12_4_ + auVar95._12_4_;
          auVar100._0_4_ = auVar65._0_4_ * auVar90._0_4_;
          auVar100._4_4_ = auVar65._4_4_ * auVar90._4_4_;
          auVar100._8_4_ = auVar65._8_4_ * auVar90._8_4_;
          auVar100._12_4_ = auVar65._12_4_ * auVar90._12_4_;
          auVar100 = vfmsub231ps_fma(auVar100,auVar89,auVar61);
          auVar70._0_4_ = auVar61._0_4_ * auVar63._0_4_;
          auVar70._4_4_ = auVar61._4_4_ * auVar63._4_4_;
          auVar70._8_4_ = auVar61._8_4_ * auVar63._8_4_;
          auVar70._12_4_ = auVar61._12_4_ * auVar63._12_4_;
          auVar61 = vfmsub231ps_fma(auVar70,auVar90,auVar93);
          auVar94._0_4_ = auVar89._0_4_ * auVar93._0_4_;
          auVar94._4_4_ = auVar89._4_4_ * auVar93._4_4_;
          auVar94._8_4_ = auVar89._8_4_ * auVar93._8_4_;
          auVar94._12_4_ = auVar89._12_4_ * auVar93._12_4_;
          auVar70 = vfmsub231ps_fma(auVar94,auVar63,auVar65);
          auVar95._0_4_ = fVar20 * auVar70._0_4_;
          auVar95._4_4_ = fVar20 * auVar70._4_4_;
          auVar95._8_4_ = fVar20 * auVar70._8_4_;
          auVar95._12_4_ = fVar20 * auVar70._12_4_;
          auVar61 = vfmadd231ps_fma(auVar95,auVar107,auVar61);
          auVar94 = vfmadd231ps_fma(auVar61,auVar117,auVar100);
          local_1458 = auVar64._0_4_;
          fStack_1454 = auVar64._4_4_;
          fStack_1450 = auVar64._8_4_;
          fStack_144c = auVar64._12_4_;
          local_1438._0_4_ = auVar94._0_4_ + local_1458 + local_1448._0_4_;
          local_1438._4_4_ = auVar94._4_4_ + fStack_1454 + local_1448._4_4_;
          local_1438._8_4_ = auVar94._8_4_ + fStack_1450 + local_1448._8_4_;
          local_1438._12_4_ = auVar94._12_4_ + fStack_144c + local_1448._12_4_;
          auVar119._8_4_ = 0x7fffffff;
          auVar119._0_8_ = 0x7fffffff7fffffff;
          auVar119._12_4_ = 0x7fffffff;
          auVar61 = vminps_avx(auVar64,local_1448);
          auVar100 = vminps_avx(auVar61,auVar94);
          auVar61 = vandps_avx(local_1438,auVar119);
          auVar108._0_4_ = auVar61._0_4_ * 1.1920929e-07;
          auVar108._4_4_ = auVar61._4_4_ * 1.1920929e-07;
          auVar108._8_4_ = auVar61._8_4_ * 1.1920929e-07;
          auVar108._12_4_ = auVar61._12_4_ * 1.1920929e-07;
          uVar55 = CONCAT44(auVar108._4_4_,auVar108._0_4_);
          auVar101._0_8_ = uVar55 ^ 0x8000000080000000;
          auVar101._8_4_ = -auVar108._8_4_;
          auVar101._12_4_ = -auVar108._12_4_;
          auVar100 = vcmpps_avx(auVar100,auVar101,5);
          auVar70 = vmaxps_avx(auVar64,local_1448);
          auVar70 = vmaxps_avx(auVar70,auVar94);
          auVar70 = vcmpps_avx(auVar70,auVar108,2);
          auVar100 = vorps_avx(auVar100,auVar70);
          if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar100[0xf] < '\0') {
            auVar71._0_4_ = fVar13 * auVar91._0_4_;
            auVar71._4_4_ = fVar15 * auVar91._4_4_;
            auVar71._8_4_ = fVar17 * auVar91._8_4_;
            auVar71._12_4_ = fVar19 * auVar91._12_4_;
            auVar96._0_4_ = fVar118 * auVar88._0_4_;
            auVar96._4_4_ = fVar120 * auVar88._4_4_;
            auVar96._8_4_ = fVar121 * auVar88._8_4_;
            auVar96._12_4_ = fVar122 * auVar88._12_4_;
            auVar95 = vfmsub213ps_fma(auVar88,auVar77,auVar71);
            auVar102._0_4_ = auVar89._0_4_ * fVar12;
            auVar102._4_4_ = auVar89._4_4_ * fVar14;
            auVar102._8_4_ = auVar89._8_4_ * fVar16;
            auVar102._12_4_ = auVar89._12_4_ * fVar18;
            auVar109._0_4_ = fVar118 * auVar90._0_4_;
            auVar109._4_4_ = fVar120 * auVar90._4_4_;
            auVar109._8_4_ = fVar121 * auVar90._8_4_;
            auVar109._12_4_ = fVar122 * auVar90._12_4_;
            auVar90 = vfmsub213ps_fma(auVar90,auVar81,auVar102);
            auVar70 = vandps_avx(auVar119,auVar71);
            auVar94 = vandps_avx(auVar119,auVar102);
            auVar70 = vcmpps_avx(auVar70,auVar94,1);
            local_13d8 = vblendvps_avx(auVar90,auVar95,auVar70);
            auVar88._0_4_ = fVar13 * auVar63._0_4_;
            auVar88._4_4_ = fVar15 * auVar63._4_4_;
            auVar88._8_4_ = fVar17 * auVar63._8_4_;
            auVar88._12_4_ = fVar19 * auVar63._12_4_;
            auVar90 = vfmsub213ps_fma(auVar63,auVar77,auVar109);
            auVar103._0_4_ = auVar97._0_4_ * fVar12;
            auVar103._4_4_ = auVar97._4_4_ * fVar14;
            auVar103._8_4_ = auVar97._8_4_ * fVar16;
            auVar103._12_4_ = auVar97._12_4_ * fVar18;
            auVar95 = vfmsub213ps_fma(auVar91,auVar62,auVar103);
            auVar70 = vandps_avx(auVar119,auVar103);
            auVar94 = vandps_avx(auVar109,auVar119);
            auVar70 = vcmpps_avx(auVar70,auVar94,1);
            local_13c8 = vblendvps_avx(auVar90,auVar95,auVar70);
            auVar90 = vfmsub213ps_fma(auVar97,auVar81,auVar96);
            auVar89 = vfmsub213ps_fma(auVar89,auVar62,auVar88);
            auVar70 = vandps_avx(auVar119,auVar96);
            auVar94 = vandps_avx(auVar119,auVar88);
            auVar70 = vcmpps_avx(auVar70,auVar94,1);
            local_13b8 = vblendvps_avx(auVar89,auVar90,auVar70);
            auVar89._0_4_ = local_13b8._0_4_ * fVar20;
            auVar89._4_4_ = local_13b8._4_4_ * fVar20;
            auVar89._8_4_ = local_13b8._8_4_ * fVar20;
            auVar89._12_4_ = local_13b8._12_4_ * fVar20;
            auVar70 = vfmadd213ps_fma(auVar107,local_13c8,auVar89);
            auVar70 = vfmadd213ps_fma(auVar117,local_13d8,auVar70);
            auVar90._0_4_ = auVar70._0_4_ + auVar70._0_4_;
            auVar90._4_4_ = auVar70._4_4_ + auVar70._4_4_;
            auVar90._8_4_ = auVar70._8_4_ + auVar70._8_4_;
            auVar90._12_4_ = auVar70._12_4_ + auVar70._12_4_;
            auVar97._0_4_ = local_13b8._0_4_ * fVar24;
            auVar97._4_4_ = local_13b8._4_4_ * fVar9;
            auVar97._8_4_ = local_13b8._8_4_ * fVar10;
            auVar97._12_4_ = local_13b8._12_4_ * fVar11;
            auVar70 = vfmadd213ps_fma(auVar73,local_13c8,auVar97);
            auVar69 = vfmadd213ps_fma(auVar69,local_13d8,auVar70);
            auVar70 = vrcpps_avx(auVar90);
            auVar112._8_4_ = 0x3f800000;
            auVar112._0_8_ = &DAT_3f8000003f800000;
            auVar112._12_4_ = 0x3f800000;
            auVar73 = vfnmadd213ps_fma(auVar70,auVar90,auVar112);
            auVar70 = vfmadd132ps_fma(auVar73,auVar70,auVar70);
            local_13e8._0_4_ = auVar70._0_4_ * (auVar69._0_4_ + auVar69._0_4_);
            local_13e8._4_4_ = auVar70._4_4_ * (auVar69._4_4_ + auVar69._4_4_);
            local_13e8._8_4_ = auVar70._8_4_ * (auVar69._8_4_ + auVar69._8_4_);
            local_13e8._12_4_ = auVar70._12_4_ * (auVar69._12_4_ + auVar69._12_4_);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar104._4_4_ = uVar2;
            auVar104._0_4_ = uVar2;
            auVar104._8_4_ = uVar2;
            auVar104._12_4_ = uVar2;
            auVar70 = vcmpps_avx(auVar104,local_13e8,2);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar105._4_4_ = uVar2;
            auVar105._0_4_ = uVar2;
            auVar105._8_4_ = uVar2;
            auVar105._12_4_ = uVar2;
            auVar69 = vcmpps_avx(local_13e8,auVar105,2);
            auVar70 = vandps_avx(auVar69,auVar70);
            auVar69 = auVar100 & auVar70;
            if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar69[0xf] < '\0') {
              auVar100 = vandps_avx(auVar70,auVar100);
              auVar70 = vcmpps_avx(auVar90,_DAT_01feba10,4);
              auVar69 = auVar70 & auVar100;
              if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar69[0xf] < '\0') {
                local_1418 = vandps_avx(auVar100,auVar70);
                auVar100 = vrcpps_avx(local_1438);
                auVar75._8_4_ = 0x3f800000;
                auVar75._0_8_ = &DAT_3f8000003f800000;
                auVar75._12_4_ = 0x3f800000;
                auVar70 = vfnmadd213ps_fma(local_1438,auVar100,auVar75);
                auVar100 = vfmadd132ps_fma(auVar70,auVar100,auVar100);
                auVar72._8_4_ = 0x219392ef;
                auVar72._0_8_ = 0x219392ef219392ef;
                auVar72._12_4_ = 0x219392ef;
                auVar61 = vcmpps_avx(auVar61,auVar72,5);
                auVar61 = vandps_avx(auVar100,auVar61);
                auVar66._0_4_ = local_1458 * auVar61._0_4_;
                auVar66._4_4_ = fStack_1454 * auVar61._4_4_;
                auVar66._8_4_ = fStack_1450 * auVar61._8_4_;
                auVar66._12_4_ = fStack_144c * auVar61._12_4_;
                local_1408 = vminps_avx(auVar66,auVar75);
                auVar67._0_4_ = auVar61._0_4_ * local_1448._0_4_;
                auVar67._4_4_ = auVar61._4_4_ * local_1448._4_4_;
                auVar67._8_4_ = auVar61._8_4_ * local_1448._8_4_;
                auVar67._12_4_ = auVar61._12_4_ * local_1448._12_4_;
                local_13f8 = vminps_avx(auVar67,auVar75);
                uVar43 = vmovmskps_avx(local_1418);
                uVar55 = (ulong)uVar43;
                do {
                  uVar44 = 0;
                  for (uVar40 = uVar55; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000
                      ) {
                    uVar44 = uVar44 + 1;
                  }
                  uVar43 = *(uint *)((long)&local_1468 + uVar44 * 4);
                  pGVar7 = (pSVar6->geometries).items[uVar43].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar55 = uVar55 ^ 1L << (uVar44 & 0x3f);
                    bVar60 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar60 = false;
                  }
                  else {
                    uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar40 = (ulong)(uint)((int)uVar44 * 4);
                    uVar4 = *(undefined4 *)(local_1408 + uVar40);
                    local_1378._4_4_ = uVar4;
                    local_1378._0_4_ = uVar4;
                    local_1378._8_4_ = uVar4;
                    local_1378._12_4_ = uVar4;
                    uVar4 = *(undefined4 *)(local_13f8 + uVar40);
                    local_1368._4_4_ = uVar4;
                    local_1368._0_4_ = uVar4;
                    local_1368._8_4_ = uVar4;
                    local_1368._12_4_ = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_13e8 + uVar40);
                    args.context = context->user;
                    local_1348._4_4_ = uVar43;
                    local_1348._0_4_ = uVar43;
                    local_1348._8_4_ = uVar43;
                    local_1348._12_4_ = uVar43;
                    uVar4 = *(undefined4 *)((long)&local_1478 + uVar40);
                    local_1358._4_4_ = uVar4;
                    local_1358._0_4_ = uVar4;
                    local_1358._8_4_ = uVar4;
                    local_1358._12_4_ = uVar4;
                    uVar4 = *(undefined4 *)(local_13d8 + uVar40);
                    uVar5 = *(undefined4 *)(local_13c8 + uVar40);
                    local_1398._4_4_ = uVar5;
                    local_1398._0_4_ = uVar5;
                    local_1398._8_4_ = uVar5;
                    local_1398._12_4_ = uVar5;
                    uVar5 = *(undefined4 *)(local_13b8 + uVar40);
                    local_1388._4_4_ = uVar5;
                    local_1388._0_4_ = uVar5;
                    local_1388._8_4_ = uVar5;
                    local_1388._12_4_ = uVar5;
                    local_13a8[0] = (RTCHitN)(char)uVar4;
                    local_13a8[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
                    local_13a8[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                    local_13a8[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                    local_13a8[4] = (RTCHitN)(char)uVar4;
                    local_13a8[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
                    local_13a8[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                    local_13a8[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                    local_13a8[8] = (RTCHitN)(char)uVar4;
                    local_13a8[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
                    local_13a8[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                    local_13a8[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                    local_13a8[0xc] = (RTCHitN)(char)uVar4;
                    local_13a8[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
                    local_13a8[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                    local_13a8[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                    vpcmpeqd_avx2(ZEXT1632(local_1348),ZEXT1632(local_1348));
                    uStack_1334 = (args.context)->instID[0];
                    local_1338 = uStack_1334;
                    uStack_1330 = uStack_1334;
                    uStack_132c = uStack_1334;
                    uStack_1328 = (args.context)->instPrimID[0];
                    uStack_1324 = uStack_1328;
                    uStack_1320 = uStack_1328;
                    uStack_131c = uStack_1328;
                    local_1548 = *local_1538;
                    uStack_1540 = local_1538[1];
                    args.valid = (int *)&local_1548;
                    args.geometryUserPtr = pGVar7->userPtr;
                    args.hit = local_13a8;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->occlusionFilterN)(&args);
                    }
                    auVar33._8_8_ = uStack_1540;
                    auVar33._0_8_ = local_1548;
                    if (auVar33 == (undefined1  [16])0x0) {
                      auVar61 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar61 = auVar61 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&args);
                      }
                      auVar34._8_8_ = uStack_1540;
                      auVar34._0_8_ = local_1548;
                      auVar100 = vpcmpeqd_avx((undefined1  [16])0x0,auVar34);
                      auVar61 = auVar100 ^ _DAT_01febe20;
                      auVar76._8_4_ = 0xff800000;
                      auVar76._0_8_ = 0xff800000ff800000;
                      auVar76._12_4_ = 0xff800000;
                      auVar100 = vblendvps_avx(auVar76,*(undefined1 (*) [16])(args.ray + 0x80),
                                               auVar100);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar100;
                    }
                    auVar61 = vpslld_avx(auVar61,0x1f);
                    bVar31 = (auVar61 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar32 = (auVar61 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar30 = (auVar61 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar29 = -1 < auVar61[0xf];
                    bVar60 = ((bVar31 && bVar32) && bVar30) && bVar29;
                    if (((bVar31 && bVar32) && bVar30) && bVar29) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar2;
                      uVar55 = uVar55 ^ 1L << (uVar44 & 0x3f);
                    }
                  }
                  if (!bVar60) {
                    if (bVar59) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar57 = 1;
                    }
                    goto LAB_006571b6;
                  }
                } while (uVar55 != 0);
              }
            }
          }
          local_1528 = local_1528 + 1;
          bVar59 = local_1528 < local_1530;
        } while (local_1528 != local_1530);
      }
    }
LAB_006571b6:
  } while ((uVar57 & 3) == 0);
  return local_1520 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }